

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

void DumpData(ostream *out,void *buffer,size_t len)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  ostream *poVar5;
  ulong uVar6;
  int i;
  long lVar7;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  uVar6 = 0;
  while( true ) {
    lVar7 = *(long *)out;
    lVar2 = *(long *)(lVar7 + -0x18);
    if (len <= uVar6) break;
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(out + *(long *)(lVar7 + -0x18) + 0x10) = 8;
    poVar5 = std::operator<<(out,0x30);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      if (uVar6 + lVar7 < len) {
        poVar5 = std::operator<<(out," ");
        lVar2 = *(long *)poVar5;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        poVar5 = std::operator<<(poVar5,0x30);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      }
      else {
        std::operator<<(out,"   ");
      }
    }
    std::operator<<(out,"  ");
    for (lVar7 = 8; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      if (uVar6 + lVar7 < len) {
        poVar5 = std::operator<<(out," ");
        lVar2 = *(long *)poVar5;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        poVar5 = std::operator<<(poVar5,0x30);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      }
      else {
        std::operator<<(out,"   ");
      }
    }
    std::operator<<(out,"  ");
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      cVar4 = ' ';
      if (uVar6 + lVar7 < len) {
        cVar4 = *(char *)((long)buffer + lVar7);
        if (cVar4 < ' ') {
          cVar4 = '.';
        }
      }
      std::operator<<(out,cVar4);
    }
    std::operator<<(out,"\n");
    buffer = (void *)((long)buffer + 0x10);
    uVar6 = uVar6 + 0x10;
  }
  *(undefined4 *)(out + lVar2 + 0x18) = uVar1;
  return;
}

Assistant:

void DumpData(std::ostream& out, void* buffer, size_t len)
{
    std::ios_base::fmtflags flags = out.flags();
    const uint8_t* data = reinterpret_cast<const uint8_t*>(buffer);
    size_t index = 0;
    while (index < len)
    {
        out << std::hex << std::setw(8) << std::setfill('0') << index;
        for (int i = 0; i < 8; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 8; i < 16; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 0; i < 16; i++)
        {
            char ch = (index + i < len ? data[i] : ' ');
            out << ((ch < 32) ? '.' : ch);
        }
        out << "\n";
        data += 16;
        index += 16;
    }
    out.flags(flags);
}